

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,unsigned_int>::
load_impl_sequence<0ul,1ul>
          (argument_loader<pybind11::detail::value_and_holder&,unsigned_int> *this,long call)

{
  undefined8 uVar1;
  handle src;
  bool bVar2;
  reference rVar3;
  
  uVar1 = **(undefined8 **)(call + 8);
  std::vector<bool,_std::allocator<bool>_>::operator[]
            ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  *(undefined8 *)(this + 8) = uVar1;
  src.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),1);
  bVar2 = type_caster<unsigned_int,_void>::load
                    ((type_caster<unsigned_int,_void> *)this,src,(*rVar3._M_p & rVar3._M_mask) != 0)
  ;
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }